

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectPoller.cpp
# Opt level: O0

void __thiscall sznet::net::SelectPoller::removeChannel(SelectPoller *this,Channel *channel)

{
  uint uVar1;
  bool bVar2;
  LogLevel LVar3;
  sz_fd v;
  int iVar4;
  uint uVar5;
  LogStream *this_00;
  self *this_01;
  mapped_type *ppCVar6;
  char *pcVar7;
  size_type sVar8;
  unsigned_long uVar9;
  reference pvVar10;
  int __c;
  key_type_conflict *__k;
  SourceFile file;
  __normal_iterator<sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
  local_1060;
  Event_t *local_1058;
  __normal_iterator<sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
  local_1050;
  __normal_iterator<sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
  local_1048;
  sz_fd local_1040;
  sz_fd local_103c;
  sz_fd channelAtEndFd;
  size_t n;
  Event_t *event;
  int idx;
  sz_fd local_1014;
  _Self local_1010 [3];
  undefined1 local_ff8 [12];
  Logger local_fe8;
  Channel *local_18;
  Channel *channel_local;
  SelectPoller *this_local;
  
  local_18 = channel;
  channel_local = (Channel *)this;
  Poller::assertInLoopThread(&this->super_Poller);
  LVar3 = Logger::logLevel();
  if ((int)LVar3 < 1) {
    Logger::SourceFile::SourceFile<103>
              ((SourceFile *)local_ff8,
               (char (*) [103])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff8._0_8_;
    file.m_size = local_ff8._8_4_;
    Logger::Logger(&local_fe8,file,0x8e,TRACE,"removeChannel");
    this_00 = Logger::stream(&local_fe8);
    this_01 = LogStream::operator<<(this_00,"fd = ");
    v = Channel::fd(local_18);
    LogStream::operator<<(this_01,v);
    Logger::~Logger(&local_fe8);
  }
  local_1014 = Channel::fd(local_18);
  local_1010[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
       ::find(&(this->super_Poller).m_channels,&local_1014);
  _idx = std::
         map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
         ::end(&(this->super_Poller).m_channels);
  bVar2 = std::operator!=(local_1010,(_Self *)&idx);
  if (!bVar2) {
    __assert_fail("m_channels.find(channel->fd()) != m_channels.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x8f,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  event._4_4_ = Channel::fd(local_18);
  __k = (key_type_conflict *)((long)&event + 4);
  ppCVar6 = std::
            map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
            ::operator[](&(this->super_Poller).m_channels,__k);
  if (*ppCVar6 != local_18) {
    __assert_fail("m_channels[channel->fd()] == channel",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x90,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  bVar2 = Channel::isNoneEvent(local_18);
  if (!bVar2) {
    __assert_fail("channel->isNoneEvent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x91,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  pcVar7 = Channel::index(local_18,(char *)__k,__c);
  iVar4 = (int)pcVar7;
  bVar2 = false;
  event._0_4_ = iVar4;
  if (-1 < iVar4) {
    sVar8 = std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
            ::size(&this->m_pollfds);
    bVar2 = iVar4 < (int)sVar8;
  }
  if (!bVar2) {
    __assert_fail("0 <= idx && idx < static_cast<int>(m_pollfds.size())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x93,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  n = (size_t)std::
              vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
              operator[](&this->m_pollfds,(long)(int)event);
  uVar1 = ((reference)n)->ev;
  uVar5 = Channel::events(local_18);
  if (uVar1 != uVar5) {
    __assert_fail("event.ev == channel->events()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                  ,0x95,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
  }
  local_103c = Channel::fd(local_18);
  _channelAtEndFd =
       std::
       map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
       ::erase(&(this->super_Poller).m_channels,&local_103c);
  if (_channelAtEndFd == 1) {
    uVar9 = implicit_cast<unsigned_long,int>((int *)&event);
    sVar8 = std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
            ::size(&this->m_pollfds);
    if (uVar9 == sVar8 - 1) {
      std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
      pop_back(&this->m_pollfds);
    }
    else {
      pvVar10 = std::
                vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
                ::back(&this->m_pollfds);
      local_1040 = pvVar10->fd;
      local_1050._M_current =
           (Event_t *)
           std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
           ::begin(&this->m_pollfds);
      local_1048 = __gnu_cxx::
                   __normal_iterator<sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
                   ::operator+(&local_1050,(long)(int)event);
      local_1060._M_current =
           (Event_t *)
           std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>
           ::end(&this->m_pollfds);
      local_1058 = (Event_t *)
                   __gnu_cxx::
                   __normal_iterator<sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
                   ::operator-(&local_1060,1);
      std::
      iter_swap<__gnu_cxx::__normal_iterator<sznet::net::Channel::Event_t*,std::vector<sznet::net::Channel::Event_t,std::allocator<sznet::net::Channel::Event_t>>>,__gnu_cxx::__normal_iterator<sznet::net::Channel::Event_t*,std::vector<sznet::net::Channel::Event_t,std::allocator<sznet::net::Channel::Event_t>>>>
                (local_1048,
                 (__normal_iterator<sznet::net::Channel::Event_t_*,_std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>_>
                  )local_1058);
      ppCVar6 = std::
                map<int,_sznet::net::Channel_*,_std::less<int>,_std::allocator<std::pair<const_int,_sznet::net::Channel_*>_>_>
                ::operator[](&(this->super_Poller).m_channels,&local_1040);
      Channel::set_index(*ppCVar6,(int)event);
      std::vector<sznet::net::Channel::Event_t,_std::allocator<sznet::net::Channel::Event_t>_>::
      pop_back(&this->m_pollfds);
    }
    return;
  }
  __assert_fail("n == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SelectPoller.cpp"
                ,0x99,"virtual void sznet::net::SelectPoller::removeChannel(Channel *)");
}

Assistant:

void SelectPoller::removeChannel(Channel* channel)
{
	Poller::assertInLoopThread();
	LOG_TRACE << "fd = " << channel->fd();
	assert(m_channels.find(channel->fd()) != m_channels.end());
	assert(m_channels[channel->fd()] == channel);
	assert(channel->isNoneEvent());
	int idx = channel->index();
	assert(0 <= idx && idx < static_cast<int>(m_pollfds.size()));
	const Channel::Event_t& event = m_pollfds[idx];
	assert(event.ev == channel->events());
	(void)event;
	// 移除
	size_t n = m_channels.erase(channel->fd());
	assert(n == 1); 
	(void)n;
	if (implicit_cast<size_t>(idx) == m_pollfds.size() - 1)
	{
		m_pollfds.pop_back();
	}
	else
	{
		auto channelAtEndFd = m_pollfds.back().fd;
		// 不要影响其他channel的下标
		std::iter_swap(m_pollfds.begin() + idx, m_pollfds.end() - 1);
		// 因为交换了位置，所以index发生了变化
		m_channels[channelAtEndFd]->set_index(idx);
		m_pollfds.pop_back();
	}
}